

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

float_specs fmt::v11::detail::parse_float_type_spec(format_specs *specs)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = *(ushort *)&specs->field_0x9 >> 8 & 1;
  uVar3 = (*(ushort *)&specs->field_0x9 & 0x200) << 7;
  if (specs->type == fixed) {
    uVar2 = (ulong)((uVar1 | specs->precision != 0) << 0x12 | uVar3 | 2);
  }
  else if (specs->type == debug) {
    uVar2 = (ulong)((uVar1 | specs->precision != 0) << 0x12 | uVar3 | 1);
  }
  else {
    uVar2 = (ulong)(uVar1 << 0x12 | uVar3);
  }
  return (float_specs)(uVar2 << 0x20);
}

Assistant:

FMT_CONSTEXPR inline auto parse_float_type_spec(const format_specs& specs)
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  default:
    FMT_FALLTHROUGH;
  case presentation_type::none:
    result.format = float_format::general;
    break;
  case presentation_type::exp:
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::fixed:
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::general:
    result.format = float_format::general;
    break;
  }
  return result;
}